

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O0

void __thiscall
ON_RandomNumberGenerator::RandomPermutation
          (ON_RandomNumberGenerator *this,void *base,size_t nel,size_t sizeof_element)

{
  uint uVar1;
  ON__UINT32 OVar2;
  uint uVar3;
  uchar *a_2;
  ON__UINT32 *a_1;
  ON__UINT64 *a;
  ON__UINT32 n;
  ON__UINT32 j;
  ON__UINT32 i;
  size_t sizeof_element_local;
  size_t nel_local;
  void *base_local;
  ON_RandomNumberGenerator *this_local;
  
  if ((((base != (void *)0x0) && (1 < nel)) && (sizeof_element != 0)) &&
     ((nel < 0x100000000 && (sizeof_element < 0x100000000)))) {
    uVar1 = (uint)nel;
    if ((sizeof_element & 7) == 0) {
      for (n = 0; n < uVar1; n = n + 1) {
        OVar2 = on_random_number(&this->m_rand_context);
        uVar3 = OVar2 % (uVar1 - n);
        if (uVar3 != 0) {
          Swap8(sizeof_element >> 3,(ON__UINT64 *)((long)base + (ulong)n * 8),
                (ON__UINT64 *)((long)base + (ulong)uVar3 * 8 + (ulong)n * 8));
        }
      }
    }
    else if ((sizeof_element & 3) == 0) {
      for (n = 0; n < uVar1; n = n + 1) {
        OVar2 = on_random_number(&this->m_rand_context);
        uVar3 = OVar2 % (uVar1 - n);
        if (uVar3 != 0) {
          Swap4(sizeof_element >> 2,(ON__UINT32 *)((long)base + (ulong)n * 4),
                (ON__UINT32 *)((long)base + (ulong)uVar3 * 4 + (ulong)n * 4));
        }
      }
    }
    else {
      for (n = 0; n < uVar1; n = n + 1) {
        OVar2 = on_random_number(&this->m_rand_context);
        uVar3 = OVar2 % (uVar1 - n);
        if (uVar3 != 0) {
          Swap1(sizeof_element,(uchar *)((long)base + (ulong)n),
                (uchar *)((long)base + (ulong)uVar3 + (ulong)n));
        }
      }
    }
  }
  return;
}

Assistant:

void ON_RandomNumberGenerator::RandomPermutation(void* base, size_t nel, size_t sizeof_element )
{
  ON__UINT32 i, j, n;

  if ( 0 == base || nel <= 1 || sizeof_element <= 0 )
    return;

#if ON_SIZEOF_POINTER > 4
  if ( nel > 0xFFFFFFFF || sizeof_element > 0xFFFFFFFF)
    return;
#endif

  n = (ON__UINT32)nel; // for 64 bit systems, nel is wider than n.

  // References: 
  //  http://en.wikipedia.org/wiki/Random_permutation
  //  http://en.wikipedia.org/wiki/Knuth_shuffle

  // Note:
  //   There is the usual "sloppy bias" in the code below because 
  //   (on_random_number(&m_rand_context) % N) is used to get a random
  //   number int the range 0 to N-1 when N is not a factor of 2^32.
  //   As usual, this bias is not worth worrying about
  //   unlsess 2^32 / N is smallish.  If you need a random
  //   permutation of a very large array, look elsewhere.

  if ( 0 == sizeof_element % sizeof(ON__UINT64) )
  {
    ON__UINT64* a = (ON__UINT64*)base;
    sizeof_element /= sizeof(a[0]);
    for ( i = 0; i < n; i++ )
    {
      j = on_random_number(&m_rand_context) % (n-i);
      if ( j )
      {
        Swap8(sizeof_element, a+i, a+i+j);
      }
    }
  }
  else if ( 0 == sizeof_element % sizeof(ON__UINT32) )
  {
    ON__UINT32* a = (ON__UINT32*)base;
    sizeof_element /= sizeof(a[0]);
    for ( i = 0; i < n; i++ )
    {
      j = on_random_number(&m_rand_context) % (n-i);
      if ( j )
      {
        Swap4(sizeof_element, a+i, a+i+j);
      }
    }
  }
  else
  {
    unsigned char* a = (unsigned char*)base;
    for ( i = 0; i < n; i++ )
    {
      j = on_random_number(&m_rand_context) % (n-i);
      if ( j )
      {
        Swap1(sizeof_element, a+i, a+i+j);
      }
    }
  }
}